

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_io.c
# Opt level: O2

int lj_cf_io_method_setvbuf(lua_State *L)

{
  FILE *__stream;
  int iVar1;
  int32_t iVar2;
  IOFileUD *pIVar3;
  
  pIVar3 = io_tofile(L);
  __stream = (FILE *)pIVar3->fp;
  iVar1 = lj_lib_checkopt(L,2,-1,"\x04full\x04line\x02no");
  iVar2 = lj_lib_optint(L,3,0x2000);
  iVar1 = setvbuf(__stream,(char *)0x0,iVar1,(long)iVar2);
  iVar1 = luaL_fileresult(L,(uint)(iVar1 == 0),(char *)0x0);
  return iVar1;
}

Assistant:

LJLIB_CF(io_method_setvbuf)
{
  FILE *fp = io_tofile(L)->fp;
  int opt = lj_lib_checkopt(L, 2, -1, "\4full\4line\2no");
  size_t sz = (size_t)lj_lib_optint(L, 3, LUAL_BUFFERSIZE);
  if (opt == 0) opt = _IOFBF;
  else if (opt == 1) opt = _IOLBF;
  else if (opt == 2) opt = _IONBF;
  return luaL_fileresult(L, setvbuf(fp, NULL, opt, sz) == 0, NULL);
}